

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

Config * __thiscall QPDFJob::Config::inputFile(Config *this,string *filename)

{
  bool bVar1;
  element_type *peVar2;
  allocator<char> local_49;
  string local_48;
  shared_ptr<char> local_28;
  string *local_18;
  string *filename_local;
  Config *this_local;
  
  local_18 = filename;
  filename_local = (string *)this;
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this->o);
  bVar1 = std::operator==(&peVar2->infilename,(nullptr_t)0x0);
  if (bVar1) {
    QUtil::make_shared_cstr((QUtil *)&local_28,local_18);
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this->o);
    std::shared_ptr<char>::operator=(&peVar2->infilename,&local_28);
    std::shared_ptr<char>::~shared_ptr(&local_28);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"input file has already been given",&local_49);
    usage(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::inputFile(std::string const& filename)
{
    if (o.m->infilename == nullptr) {
        o.m->infilename = QUtil::make_shared_cstr(filename);
    } else {
        usage("input file has already been given");
    }
    return this;
}